

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

void __thiscall
QGraphicsWidgetPrivate::windowFrameMouseReleaseEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  bool bVar1;
  QGraphicsWidget *this_00;
  pointer pWVar2;
  QStyle *pQVar3;
  pointer pQVar4;
  qreal *pqVar5;
  QWidget *pQVar6;
  QPoint QVar7;
  ulong uVar8;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QGraphicsWidget *in_RSI;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsWidget *q;
  QPointF pos;
  QStyleOptionTitleBar bar;
  undefined8 in_stack_fffffffffffffee8;
  SubControl flags;
  QGraphicsWidgetPrivate *in_stack_fffffffffffffef0;
  QGraphicsWidget *in_stack_fffffffffffffef8;
  QRect *in_stack_ffffffffffffff00;
  QPointF *this_01;
  QGraphicsWidget *this_02;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_d8;
  Representation local_d4;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QPointF local_b8 [3];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  QPointF local_68 [6];
  long local_8;
  
  flags = (SubControl)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RSI;
  this_00 = q_func(in_RDI);
  __fd = (int)in_RSI;
  ensureWindowData(in_stack_fffffffffffffef0);
  pWVar2 = std::
           unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                         *)0xa572c5);
  if (pWVar2->grabbedSection != NoSection) {
    pWVar2 = std::
             unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                           *)0xa572e0);
    if (pWVar2->grabbedSection == TitleBarArea) {
      pWVar2 = std::
               unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                             *)0xa572fb);
      pWVar2->field_0x20 = pWVar2->field_0x20 & 0xfd;
      memset(local_78,0xaa,0x70);
      QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)0xa5732b);
      initStyleOptionTitleBar
                ((QGraphicsWidgetPrivate *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (QStyleOptionTitleBar *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      QGraphicsWidget::windowFrameRect(this_02);
      local_88 = (undefined1  [16])QRectF::toRect((QRectF *)this_02);
      local_68[0].xp = (qreal)local_88._0_8_;
      local_68[0].yp = (qreal)local_88._8_8_;
      QRect::moveTo(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                    (int)in_stack_fffffffffffffef8);
      this_01 = local_68;
      pQVar3 = QGraphicsWidget::style(in_stack_fffffffffffffef8);
      (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x1a,local_78,0);
      QRect::setHeight((QRect *)in_stack_fffffffffffffef0,flags);
      local_b8[0].yp = -NAN;
      local_b8[0].xp = -NAN;
      local_b8[0] = QGraphicsSceneMouseEvent::pos
                              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffef8);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa5741c);
      if (bVar1) {
        pQVar4 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                           ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa57433);
        in_stack_fffffffffffffef0 = (QGraphicsWidgetPrivate *)QMarginsF::left(pQVar4);
        pqVar5 = QPointF::rx(local_b8);
        *pqVar5 = (double)in_stack_fffffffffffffef0 + *pqVar5;
        pQVar4 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                           ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa5746a);
        in_stack_fffffffffffffef8 = (QGraphicsWidget *)QMarginsF::top(pQVar4);
        pqVar5 = QPointF::ry(local_b8);
        *pqVar5 = (double)in_stack_fffffffffffffef8 + *pqVar5;
      }
      QFlags<QStyle::SubControl>::QFlags
                ((QFlags<QStyle::SubControl> *)in_stack_fffffffffffffef0,flags);
      pQVar3 = QGraphicsWidget::style(in_stack_fffffffffffffef8);
      pQVar6 = QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0xa574c2);
      in_RCX = (socklen_t *)0x8;
      (**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,5,local_78,8,pQVar6);
      QVar7 = QPointF::toPoint(this_01);
      local_d4 = QVar7.xp.m_i;
      __fd = (int)&local_d4;
      uVar8 = QRect::contains((QPoint *)&stack0xffffffffffffff34,SUB81(&local_d4,0));
      if ((uVar8 & 1) != 0) {
        QGraphicsWidget::close((QGraphicsWidget *)this_00,__fd);
      }
      QStyleOptionTitleBar::~QStyleOptionTitleBar((QStyleOptionTitleBar *)in_stack_fffffffffffffef0)
      ;
    }
    local_d8.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffef0);
    bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_d8);
    __addr = extraout_RDX;
    if (bVar1) {
      pWVar2 = std::
               unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                             *)0xa5755a);
      pWVar2->grabbedSection = NoSection;
      __addr = extraout_RDX_00;
    }
    QEvent::accept((QEvent *)this_02,__fd,__addr,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameMouseReleaseEvent(QGraphicsSceneMouseEvent *event)
{
    Q_Q(QGraphicsWidget);
    ensureWindowData();
    if (windowData->grabbedSection != Qt::NoSection) {
        if (windowData->grabbedSection == Qt::TitleBarArea) {
            windowData->buttonSunken = false;
            QStyleOptionTitleBar bar;
            initStyleOptionTitleBar(&bar);
            // make sure that the coordinates (rect and pos) we send to the style are positive.
            bar.rect = q->windowFrameRect().toRect();
            bar.rect.moveTo(0,0);
            bar.rect.setHeight(q->style()->pixelMetric(QStyle::PM_TitleBarHeight, &bar));
            QPointF pos = event->pos();
            if (windowFrameMargins) {
                pos.rx() += windowFrameMargins->left();
                pos.ry() += windowFrameMargins->top();
            }
            bar.subControls = QStyle::SC_TitleBarCloseButton;
            if (q->style()->subControlRect(QStyle::CC_TitleBar, &bar,
                                           QStyle::SC_TitleBarCloseButton,
                                           event->widget()).contains(pos.toPoint())) {
                q->close();
            }
        }
        if (!(static_cast<QGraphicsSceneMouseEvent *>(event)->buttons()))
            windowData->grabbedSection = Qt::NoSection;
        event->accept();
    }
}